

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler_goesr.h
# Opt level: O2

void __thiscall GOESRProduct::~GOESRProduct(GOESRProduct *this)

{
  std::__cxx11::string::~string((string *)&this->resolution_);
  std::__cxx11::string::~string((string *)&this->imagingMode_);
  std::__cxx11::string::~string((string *)&this->instrument_);
  std::__cxx11::string::~string((string *)&this->satellite_);
  Channel::~Channel(&this->channel_);
  Region::~Region(&this->region_);
  Product::~Product(&this->product_);
  std::
  vector<std::shared_ptr<const_lrit::File>,_std::allocator<std::shared_ptr<const_lrit::File>_>_>::
  ~vector(&this->files_);
  return;
}

Assistant:

GOESRProduct() = default;